

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O1

void __thiscall
duckdb::WindowBoundariesState::FrameEnd
          (WindowBoundariesState *this,DataChunk *bounds,idx_t row_idx,idx_t count,
          WindowInputExpression *boundary_end,ValidityMask *order_mask,
          optional_ptr<duckdb::WindowCursor,_true> range)

{
  FrameBounds *prev;
  size_type *psVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  idx_t *piVar4;
  idx_t *piVar5;
  _Head_base<0UL,_duckdb::WindowCursor_*,_false> __ptr;
  unsigned_long *puVar6;
  size_type sVar7;
  WindowCursor *pWVar8;
  undefined1 auVar9 [16];
  bool bVar10;
  reference pvVar11;
  reference pvVar12;
  idx_t iVar13;
  unsigned_long uVar14;
  type pWVar15;
  idx_t iVar16;
  OutOfRangeException *pOVar17;
  InternalException *this_00;
  ulong uVar18;
  data_ptr_t pdVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  unsigned_long n;
  undefined1 local_60 [16];
  size_type local_50;
  optional_ptr<duckdb::WindowCursor,_true> *local_48;
  idx_t *local_40;
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *local_38;
  long lVar24;
  
  pvVar11 = vector<duckdb::Vector,_true>::operator[](&bounds->data,0);
  psVar1 = (size_type *)pvVar11->data;
  pvVar11 = vector<duckdb::Vector,_true>::operator[](&bounds->data,1);
  pdVar2 = pvVar11->data;
  pvVar11 = vector<duckdb::Vector,_true>::operator[](&bounds->data,3);
  pdVar3 = pvVar11->data;
  pvVar11 = vector<duckdb::Vector,_true>::operator[](&bounds->data,4);
  piVar4 = (idx_t *)pvVar11->data;
  pvVar11 = vector<duckdb::Vector,_true>::operator[](&bounds->data,5);
  piVar5 = (idx_t *)pvVar11->data;
  pvVar11 = vector<duckdb::Vector,_true>::operator[](&bounds->data,7);
  pdVar19 = pvVar11->data;
  local_50 = *psVar1;
  (this->prev).start = *piVar4;
  (this->prev).end = *piVar5;
  local_48 = (optional_ptr<duckdb::WindowCursor,_true> *)piVar5;
  local_40 = piVar4;
  if (((this->has_preceding_range != false) || (this->has_following_range == true)) &&
     ((this->range_lo).ptr != range.ptr)) {
    (this->range_lo).ptr = range.ptr;
    optional_ptr<duckdb::WindowCursor,_true>::CheckValid(&this->range_lo);
    WindowCursor::Copy((WindowCursor *)&n);
    uVar14 = n;
    n = 0;
    __ptr._M_head_impl =
         (this->range_hi).
         super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
         super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
         super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl;
    (this->range_hi).
    super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
    super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
    super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl = (WindowCursor *)uVar14;
    if (__ptr._M_head_impl != (WindowCursor *)0x0) {
      ::std::default_delete<duckdb::WindowCursor>::operator()
                ((default_delete<duckdb::WindowCursor> *)&this->range_hi,__ptr._M_head_impl);
    }
    if (n != 0) {
      ::std::default_delete<duckdb::WindowCursor>::operator()
                ((default_delete<duckdb::WindowCursor> *)&n,(WindowCursor *)n);
    }
  }
  auVar9 = _DAT_01356200;
  if (this->end_boundary < (EXPR_FOLLOWING_RANGE|CURRENT_ROW_ROWS)) {
    prev = &this->prev;
    switch(this->end_boundary) {
    default:
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      n = (unsigned_long)local_60;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&n,"Unsupported window end boundary","");
      InternalException::InternalException(this_00,(string *)&n);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case UNBOUNDED_FOLLOWING:
      pvVar11 = vector<duckdb::Vector,_true>::operator[](&bounds->data,7);
      pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,1);
      Vector::Reference(pvVar11,pvVar12);
      return;
    case CURRENT_ROW_RANGE:
    case CURRENT_ROW_GROUPS:
      pvVar11 = vector<duckdb::Vector,_true>::operator[](&bounds->data,7);
      pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,3);
      Vector::Reference(pvVar11,pvVar12);
      pdVar19 = pdVar3;
      break;
    case CURRENT_ROW_ROWS:
      if (count != 0) {
        lVar24 = count - 1;
        auVar26._8_4_ = (int)row_idx;
        auVar26._0_8_ = row_idx;
        auVar26._12_4_ = (int)(row_idx >> 0x20);
        lVar21 = row_idx + (long)DAT_0135e310;
        lVar22 = auVar26._8_8_ + DAT_0135e310._8_8_;
        auVar25._8_4_ = (int)lVar24;
        auVar25._0_8_ = lVar24;
        auVar25._12_4_ = (int)((ulong)lVar24 >> 0x20);
        uVar20 = 0;
        auVar25 = auVar25 ^ _DAT_01356200;
        auVar23 = _DAT_0135e310;
        do {
          auVar26 = auVar23 ^ auVar9;
          if ((bool)(~(auVar26._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar26._0_4_ ||
                      auVar25._4_4_ < auVar26._4_4_) & 1)) {
            *(long *)(pdVar19 + uVar20 * 8) = lVar21 + 1;
          }
          if ((auVar26._12_4_ != auVar25._12_4_ || auVar26._8_4_ <= auVar25._8_4_) &&
              auVar26._12_4_ <= auVar25._12_4_) {
            *(long *)(pdVar19 + uVar20 * 8 + 8) = lVar22 + 1;
          }
          uVar20 = uVar20 + 2;
          lVar21 = lVar21 + 2;
          lVar22 = lVar22 + 2;
          lVar24 = auVar23._8_8_;
          auVar23._0_8_ = auVar23._0_8_ + 2;
          auVar23._8_8_ = lVar24 + 2;
        } while ((count + 1 & 0xfffffffffffffffe) != uVar20);
      }
      break;
    case EXPR_PRECEDING_ROWS:
      if (count != 0) {
        iVar16 = 0;
        do {
          pvVar11 = vector<duckdb::Vector,_true>::operator[]
                              (&boundary_end->chunk->data,boundary_end->col_idx);
          iVar13 = 0;
          if (boundary_end->scalar == false) {
            iVar13 = iVar16;
          }
          bVar10 = TrySubtractOperator::Operation<long,long,long>
                             (row_idx + 1 + iVar16,*(int64_t *)(pvVar11->data + iVar13 * 8),
                              (int64_t *)&n);
          if (bVar10) {
            uVar14 = n;
            if ((long)n < 1) {
              uVar14 = 0;
            }
          }
          else {
            uVar14 = *(unsigned_long *)(pdVar2 + iVar16 * 8);
          }
          *(unsigned_long *)(pdVar19 + iVar16 * 8) = uVar14;
          iVar16 = iVar16 + 1;
        } while (count != iVar16);
      }
      break;
    case EXPR_FOLLOWING_ROWS:
      if (count != 0) {
        iVar16 = 0;
        do {
          pvVar11 = vector<duckdb::Vector,_true>::operator[]
                              (&boundary_end->chunk->data,boundary_end->col_idx);
          iVar13 = 0;
          if (boundary_end->scalar == false) {
            iVar13 = iVar16;
          }
          bVar10 = TryAddOperator::Operation<long,long,long>
                             (row_idx + 1 + iVar16,*(int64_t *)(pvVar11->data + iVar13 * 8),
                              (int64_t *)&n);
          if (bVar10) {
            uVar14 = n;
            if ((long)n < 1) {
              uVar14 = 0;
            }
          }
          else {
            uVar14 = *(unsigned_long *)(pdVar2 + iVar16 * 8);
          }
          *(unsigned_long *)(pdVar19 + iVar16 * 8) = uVar14;
          iVar16 = iVar16 + 1;
        } while (count != iVar16);
      }
      break;
    case EXPR_PRECEDING_RANGE:
      if (count != 0) {
        local_48 = &this->range_lo;
        uVar20 = 0;
        do {
          pvVar11 = vector<duckdb::Vector,_true>::operator[]
                              (&boundary_end->chunk->data,boundary_end->col_idx);
          puVar6 = (pvVar11->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (boundary_end->scalar == true) {
            if (puVar6 == (unsigned_long *)0x0) goto LAB_00cd070f;
            uVar18 = (ulong)((uint)*puVar6 & 1);
LAB_00cd0706:
            if (uVar18 != 0) goto LAB_00cd070f;
            iVar16 = *(idx_t *)(pdVar3 + uVar20 * 8);
          }
          else {
            if (puVar6 != (unsigned_long *)0x0) {
              uVar18 = 1L << ((byte)uVar20 & 0x3f) & puVar6[uVar20 >> 6];
              goto LAB_00cd0706;
            }
LAB_00cd070f:
            iVar16 = local_40[uVar20];
            prev->start = iVar16;
            sVar7 = psVar1[uVar20];
            if (sVar7 != local_50) {
              (this->prev).end = this->valid_end;
              local_50 = sVar7;
            }
            optional_ptr<duckdb::WindowCursor,_true>::CheckValid(local_48);
            pWVar8 = (this->range_lo).ptr;
            pWVar15 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                      ::operator*(&this->range_hi);
            iVar16 = FindOrderedRangeBound<false>
                               (pWVar8,pWVar15,this->range_sense,iVar16,row_idx + 1 + uVar20,
                                this->end_boundary,boundary_end,uVar20,prev);
            (this->prev).end = iVar16;
          }
          *(idx_t *)(pdVar19 + uVar20 * 8) = iVar16;
          uVar20 = uVar20 + 1;
        } while (count != uVar20);
      }
      break;
    case EXPR_FOLLOWING_RANGE:
      if (count != 0) {
        local_38 = &this->range_hi;
        uVar20 = 0;
        do {
          pvVar11 = vector<duckdb::Vector,_true>::operator[]
                              (&boundary_end->chunk->data,boundary_end->col_idx);
          puVar6 = (pvVar11->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (boundary_end->scalar == true) {
            if (puVar6 == (unsigned_long *)0x0) goto LAB_00cd0902;
            uVar18 = (ulong)((uint)*puVar6 & 1);
LAB_00cd08f9:
            if (uVar18 != 0) goto LAB_00cd0902;
            iVar16 = *(idx_t *)(pdVar3 + uVar20 * 8);
          }
          else {
            if (puVar6 != (unsigned_long *)0x0) {
              uVar18 = 1L << ((byte)uVar20 & 0x3f) & puVar6[uVar20 >> 6];
              goto LAB_00cd08f9;
            }
LAB_00cd0902:
            iVar16 = *(idx_t *)(local_48 + uVar20);
            prev->start = local_40[uVar20];
            sVar7 = psVar1[uVar20];
            if (sVar7 != local_50) {
              (this->prev).end = iVar16;
              local_50 = sVar7;
            }
            optional_ptr<duckdb::WindowCursor,_true>::CheckValid(&this->range_lo);
            pWVar8 = (this->range_lo).ptr;
            pWVar15 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                      ::operator*(local_38);
            iVar16 = FindOrderedRangeBound<false>
                               (pWVar8,pWVar15,this->range_sense,row_idx + uVar20,iVar16,
                                this->end_boundary,boundary_end,uVar20,prev);
            (this->prev).end = iVar16;
          }
          *(idx_t *)(pdVar19 + uVar20 * 8) = iVar16;
          uVar20 = uVar20 + 1;
        } while (count != uVar20);
      }
      break;
    case EXPR_PRECEDING_GROUPS:
      if (count != 0) {
        uVar20 = 0;
        do {
          pvVar11 = vector<duckdb::Vector,_true>::operator[]
                              (&boundary_end->chunk->data,boundary_end->col_idx);
          puVar6 = (pvVar11->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (boundary_end->scalar == true) {
            if (puVar6 == (unsigned_long *)0x0) goto LAB_00cd04a3;
            uVar18 = (ulong)((uint)*puVar6 & 1);
LAB_00cd049e:
            if (uVar18 != 0) goto LAB_00cd04a3;
            iVar13 = *(idx_t *)(pdVar3 + uVar20 * 8);
          }
          else {
            if (puVar6 != (unsigned_long *)0x0) {
              uVar18 = 1L << ((byte)uVar20 & 0x3f) & puVar6[uVar20 >> 6];
              goto LAB_00cd049e;
            }
LAB_00cd04a3:
            iVar13 = *(idx_t *)(pdVar3 + uVar20 * 8);
            iVar16 = psVar1[uVar20];
            pvVar11 = vector<duckdb::Vector,_true>::operator[]
                                (&boundary_end->chunk->data,boundary_end->col_idx);
            uVar18 = 0;
            if (boundary_end->scalar == false) {
              uVar18 = uVar20;
            }
            uVar14 = *(unsigned_long *)(pvVar11->data + uVar18 * 8);
            if ((long)uVar14 < 0) {
              pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
              n = (unsigned_long)local_60;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&n,"Invalid GROUPS PRECEDING value","");
              OutOfRangeException::OutOfRangeException(pOVar17,(string *)&n);
              __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            if (uVar14 != 0) {
              n = uVar14;
              iVar13 = FindPrevStart(order_mask,iVar16,iVar13,&n);
            }
          }
          *(idx_t *)(pdVar19 + uVar20 * 8) = iVar13;
          uVar20 = uVar20 + 1;
        } while (count != uVar20);
      }
      break;
    case EXPR_FOLLOWING_GROUPS:
      if (count != 0) {
        uVar20 = 0;
        do {
          pvVar11 = vector<duckdb::Vector,_true>::operator[]
                              (&boundary_end->chunk->data,boundary_end->col_idx);
          puVar6 = (pvVar11->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (boundary_end->scalar == true) {
            if (puVar6 == (unsigned_long *)0x0) goto LAB_00cd0608;
            uVar18 = (ulong)((uint)*puVar6 & 1);
LAB_00cd0603:
            if (uVar18 != 0) goto LAB_00cd0608;
            iVar13 = *(idx_t *)(pdVar3 + uVar20 * 8);
          }
          else {
            if (puVar6 != (unsigned_long *)0x0) {
              uVar18 = 1L << ((byte)uVar20 & 0x3f) & puVar6[uVar20 >> 6];
              goto LAB_00cd0603;
            }
LAB_00cd0608:
            iVar13 = *(idx_t *)(pdVar3 + uVar20 * 8);
            iVar16 = *(idx_t *)(pdVar2 + uVar20 * 8);
            pvVar11 = vector<duckdb::Vector,_true>::operator[]
                                (&boundary_end->chunk->data,boundary_end->col_idx);
            uVar18 = 0;
            if (boundary_end->scalar == false) {
              uVar18 = uVar20;
            }
            uVar14 = *(unsigned_long *)(pvVar11->data + uVar18 * 8);
            if ((long)uVar14 < 0) {
              pOVar17 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
              n = (unsigned_long)local_60;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&n,"Invalid GROUPS FOLLOWING value","");
              OutOfRangeException::OutOfRangeException(pOVar17,(string *)&n);
              __cxa_throw(pOVar17,&OutOfRangeException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            if (uVar14 != 0) {
              n = uVar14;
              iVar13 = FindNextStart(order_mask,iVar13 + 1,iVar16,&n);
            }
          }
          *(idx_t *)(pdVar19 + uVar20 * 8) = iVar13;
          uVar20 = uVar20 + 1;
        } while (count != uVar20);
      }
    }
  }
  if (count != 0) {
    iVar16 = 0;
    do {
      uVar20 = psVar1[iVar16];
      if (psVar1[iVar16] < *(ulong *)(pdVar19 + iVar16 * 8)) {
        uVar20 = *(ulong *)(pdVar19 + iVar16 * 8);
      }
      if (*(ulong *)(pdVar2 + iVar16 * 8) <= uVar20) {
        uVar20 = *(ulong *)(pdVar2 + iVar16 * 8);
      }
      *(ulong *)(pdVar19 + iVar16 * 8) = uVar20;
      iVar16 = iVar16 + 1;
    } while (count != iVar16);
  }
  return;
}

Assistant:

void WindowBoundariesState::FrameEnd(DataChunk &bounds, idx_t row_idx, const idx_t count,
                                     WindowInputExpression &boundary_end, const ValidityMask &order_mask,
                                     optional_ptr<WindowCursor> range) {
	auto partition_begin_data = FlatVector::GetData<const idx_t>(bounds.data[PARTITION_BEGIN]);
	auto partition_end_data = FlatVector::GetData<idx_t>(bounds.data[PARTITION_END]);
	auto peer_end_data = FlatVector::GetData<idx_t>(bounds.data[PEER_END]);
	auto valid_begin_data = FlatVector::GetData<const idx_t>(bounds.data[VALID_BEGIN]);
	auto valid_end_data = FlatVector::GetData<const idx_t>(bounds.data[VALID_END]);
	auto frame_end_data = FlatVector::GetData<idx_t>(bounds.data[FRAME_END]);

	idx_t window_end = NumericLimits<idx_t>::Maximum();

	//	Reset previous range hints
	idx_t prev_partition = partition_begin_data[0];
	prev.start = valid_begin_data[0];
	prev.end = valid_end_data[0];

	if (has_preceding_range || has_following_range) {
		if (range_lo.get() != range.get()) {
			range_lo = range.get();
			range_hi = range_lo->Copy();
		}
	}

	switch (end_boundary) {
	case WindowBoundary::CURRENT_ROW_ROWS:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			frame_end_data[chunk_idx] = row_idx + 1;
		}
		break;
	case WindowBoundary::CURRENT_ROW_RANGE:
	case WindowBoundary::CURRENT_ROW_GROUPS:
		// in RANGE or GROUPS mode it means that the frame starts or ends with the current row's
		// first or last peer in the ORDER BY ordering
		bounds.data[FRAME_END].Reference(bounds.data[PEER_END]);
		frame_end_data = peer_end_data;
		break;
	case WindowBoundary::UNBOUNDED_FOLLOWING:
		bounds.data[FRAME_END].Reference(bounds.data[PARTITION_END]);
		// No need to clamp
		return;
	case WindowBoundary::EXPR_PRECEDING_ROWS: {
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			int64_t computed_start;
			if (!TrySubtractOperator::Operation(int64_t(row_idx + 1), boundary_end.GetCell<int64_t>(chunk_idx),
			                                    computed_start)) {
				window_end = partition_end_data[chunk_idx];
			} else {
				window_end = UnsafeNumericCast<idx_t>(MaxValue<int64_t>(computed_start, 0));
			}
			frame_end_data[chunk_idx] = window_end;
		}
		break;
	}
	case WindowBoundary::EXPR_FOLLOWING_ROWS:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			int64_t computed_start;
			if (!TryAddOperator::Operation(int64_t(row_idx + 1), boundary_end.GetCell<int64_t>(chunk_idx),
			                               computed_start)) {
				window_end = partition_end_data[chunk_idx];
			} else {
				window_end = UnsafeNumericCast<idx_t>(MaxValue<int64_t>(computed_start, 0));
			}
			frame_end_data[chunk_idx] = window_end;
		}
		break;
	case WindowBoundary::EXPR_PRECEDING_RANGE:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_end.CellIsNull(chunk_idx)) {
				window_end = peer_end_data[chunk_idx];
			} else {
				const auto valid_start = valid_begin_data[chunk_idx];
				prev.start = valid_start;
				const auto cur_partition = partition_begin_data[chunk_idx];
				if (cur_partition != prev_partition) {
					prev.end = valid_end;
					prev_partition = cur_partition;
				}
				window_end = FindOrderedRangeBound<false>(*range_lo, *range_hi, range_sense, valid_start, row_idx + 1,
				                                          end_boundary, boundary_end, chunk_idx, prev);
				prev.end = window_end;
			}
			frame_end_data[chunk_idx] = window_end;
		}
		break;
	case WindowBoundary::EXPR_FOLLOWING_RANGE:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_end.CellIsNull(chunk_idx)) {
				window_end = peer_end_data[chunk_idx];
			} else {
				const auto valid_end = valid_end_data[chunk_idx];
				prev.start = valid_begin_data[chunk_idx];
				const auto cur_partition = partition_begin_data[chunk_idx];
				if (cur_partition != prev_partition) {
					prev.end = valid_end;
					prev_partition = cur_partition;
				}
				window_end = FindOrderedRangeBound<false>(*range_lo, *range_hi, range_sense, row_idx, valid_end,
				                                          end_boundary, boundary_end, chunk_idx, prev);
				prev.end = window_end;
			}
			frame_end_data[chunk_idx] = window_end;
		}
		break;
	case WindowBoundary::EXPR_PRECEDING_GROUPS:
		// In GROUPS mode, the offset is an integer indicating that the frame starts or ends that many peer groups
		// before or after the current row's peer group, where a peer group is a group of rows that are equivalent
		// according to the window's ORDER BY clause.
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_end.CellIsNull(chunk_idx)) {
				window_end = peer_end_data[chunk_idx];
			} else {
				//	Count peer groups backwards.
				const auto peer_end = peer_end_data[chunk_idx];
				const auto partition_begin = partition_begin_data[chunk_idx];
				const auto boundary = boundary_end.GetCell<int64_t>(chunk_idx);
				if (boundary < 0) {
					throw OutOfRangeException("Invalid GROUPS PRECEDING value");
				} else if (!boundary) {
					window_end = peer_end;
				} else {
					auto n = UnsafeNumericCast<idx_t>(boundary);
					window_end = FindPrevStart(order_mask, partition_begin, peer_end, n);
				}
			}
			frame_end_data[chunk_idx] = window_end;
		}
		break;
	case WindowBoundary::EXPR_FOLLOWING_GROUPS:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_end.CellIsNull(chunk_idx)) {
				window_end = peer_end_data[chunk_idx];
			} else {
				//	Count peer groups forward.
				const auto peer_end = peer_end_data[chunk_idx];
				const auto partition_end = partition_end_data[chunk_idx];
				const auto boundary = boundary_end.GetCell<int64_t>(chunk_idx);
				if (boundary < 0) {
					throw OutOfRangeException("Invalid GROUPS FOLLOWING value");
				} else if (!boundary) {
					window_end = peer_end;
				} else {
					auto n = UnsafeNumericCast<idx_t>(boundary);
					window_end = FindNextStart(order_mask, peer_end + 1, partition_end, n);
				}
			}
			frame_end_data[chunk_idx] = window_end;
		}
		break;
	case WindowBoundary::UNBOUNDED_PRECEDING:
	case WindowBoundary::INVALID:
		throw InternalException("Unsupported window end boundary");
	}

	ClampFrame(count, frame_end_data, partition_begin_data, partition_end_data);
}